

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.c
# Opt level: O1

int getn(vorb *z,uint8 *data,int n)

{
  uint8 *__src;
  size_t sVar1;
  ulong __size;
  
  __src = z->stream;
  __size = (ulong)(uint)n;
  if (__src == (uint8 *)0x0) {
    sVar1 = fread(data,__size,1,(FILE *)z->f);
    if (sVar1 == 1) {
      return 1;
    }
  }
  else if (__src + __size <= z->stream_end) {
    memcpy(data,__src,__size);
    z->stream = z->stream + __size;
    return 1;
  }
  z->eof = 1;
  return 0;
}

Assistant:

static int getn(vorb *z, uint8 *data, int n)
{
   if (USE_MEMORY(z)) {
      if (z->stream+n > z->stream_end) { z->eof = 1; return 0; }
      memcpy(data, z->stream, n);
      z->stream += n;
      return 1;
   }

   #ifndef STB_VORBIS_NO_STDIO
   if (fread(data, n, 1, z->f) == 1)
      return 1;
   else {
      z->eof = 1;
      return 0;
   }
   #endif
}